

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void anon_unknown.dwarf_19bca9::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  ostream *poVar1;
  void *pvVar2;
  char *__filename;
  int in_ESI;
  int in_EDI;
  string *in_stack_00000018;
  int i;
  string fn;
  string *in_stack_00000340;
  string *in_stack_000003e8;
  int in_stack_000003f4;
  int local_3c;
  string local_38 [8];
  char *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
  poVar1 = std::operator<<(poVar1," part(s).");
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
    generateRandomFile(in_stack_000003f4,in_stack_000003e8);
    readWholeFiles(in_stack_00000340);
    readPartialFiles(fn._4_4_,in_stack_00000018);
    __filename = (char *)std::__cxx11::string::c_str();
    remove(__filename);
    pvVar2 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar2,std::flush<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;
    std::string fn = tempDir + "imf_test_multipart_threading.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str ());

        cout << endl << flush;
    }
}